

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  void *pvVar4;
  short sVar5;
  bool bVar6;
  short sVar7;
  bool bVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  short sVar17;
  uint uVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  long lVar21;
  ulong uVar22;
  short sVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  short sVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  short sVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int32_t i;
  ulong uVar38;
  undefined8 unaff_R15;
  short sVar39;
  short sVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  short sVar46;
  short sVar47;
  short sVar53;
  short sVar54;
  undefined1 auVar45 [16];
  undefined4 uVar55;
  ushort uVar62;
  ushort uVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar60;
  ushort uVar61;
  ushort uVar63;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  undefined1 auVar59 [16];
  ushort uVar68;
  undefined4 uVar69;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ushort uVar79;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ushort uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ulong uVar94;
  undefined1 auVar95 [16];
  long lVar96;
  ulong uVar98;
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  short sVar101;
  ulong uVar102;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar109;
  short sVar110;
  short sVar111;
  undefined1 auVar103 [16];
  long lVar108;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar118;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  __m128i vWH;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  int32_t in_stack_fffffffffffffc98;
  int32_t in_stack_fffffffffffffca0;
  uint local_354;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_2d8 [16];
  short local_2c8;
  short sStack_2c6;
  undefined1 local_2b8 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined8 uStack_260;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  undefined8 local_d8;
  undefined8 uStack_d0;
  short sVar128;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  short sVar137;
  short sVar138;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_diag_sse41_128_16_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar22 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_nw_stats_rowcol_diag_sse41_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_rowcol_diag_sse41_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_nw_stats_rowcol_diag_sse41_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_rowcol_diag_sse41_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_rowcol_diag_sse41_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_0072cef0;
  }
  _s1Len = matrix->length;
LAB_0072cef0:
  iVar30 = -open;
  iVar32 = matrix->min;
  iVar19 = -iVar32;
  if (iVar32 != iVar30 && SBORROW4(iVar32,iVar30) == iVar32 + open < 0) {
    iVar19 = open;
  }
  iVar32 = matrix->max;
  ppVar20 = parasail_result_new_rowcol3(_s1Len,s2Len);
  if (ppVar20 != (parasail_result_t *)0x0) {
    iVar1 = _s1Len + 7;
    ppVar20->flag = ppVar20->flag | 0x8251001;
    ptr = parasail_memalign_int16_t(0x10,(long)iVar1);
    uVar29 = (ulong)(s2Len + 0xe);
    ptr_00 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_01 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_02 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_03 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_04 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_05 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_06 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_07 = parasail_memalign_int16_t(0x10,uVar29);
    ptr_08 = parasail_memalign_int16_t(0x10,uVar29);
    auVar81._0_8_ = -(ulong)(ptr == (int16_t *)0x0);
    auVar81._8_8_ = -(ulong)(ptr_00 == (int16_t *)0x0);
    auVar80._0_8_ = -(ulong)(ptr_01 == (int16_t *)0x0);
    auVar80._8_8_ = -(ulong)(ptr_02 == (int16_t *)0x0);
    auVar80 = packssdw(auVar81,auVar80);
    auVar57._0_8_ = -(ulong)(ptr_03 == (int16_t *)0x0);
    auVar57._8_8_ = -(ulong)(ptr_04 == (int16_t *)0x0);
    auVar56._0_8_ = -(ulong)(ptr_05 == (int16_t *)0x0);
    auVar56._8_8_ = -(ulong)(ptr_06 == (int16_t *)0x0);
    auVar56 = packssdw(auVar57,auVar56);
    auVar56 = packssdw(auVar80,auVar56);
    if ((ptr_08 != (int16_t *)0x0 && ptr_07 != (int16_t *)0x0) &&
        ((((((((((((((((auVar56 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar56 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar56 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar56 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar56 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar56 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar56 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar56 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar56 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar56 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar56 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar56 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar56[0xf]))
    {
      uVar37 = iVar19 - 0x7fff;
      auVar56 = pshuflw(ZEXT416(uVar37),ZEXT416(uVar37),0);
      uVar41 = auVar56._0_4_;
      local_2c8 = auVar56._0_2_;
      sStack_2c6 = auVar56._2_2_;
      auVar56 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),0x7ffe - (short)iVar32));
      auVar56 = pshuflw(auVar56,auVar56,0);
      auVar80 = pshuflw((undefined1  [16])0x0,ZEXT416((uint)open),0);
      auVar57 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
      uVar55 = auVar57._0_4_;
      auVar57 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
      local_238._4_4_ = auVar57._0_4_;
      local_238._0_4_ = local_238._4_4_;
      local_238._8_4_ = local_238._4_4_;
      local_238._12_4_ = local_238._4_4_;
      auVar100._8_4_ = 0xffffffff;
      auVar100._0_8_ = 0xffffffffffffffff;
      auVar100._12_4_ = 0xffffffff;
      auVar57 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
      local_218._4_4_ = auVar57._0_4_;
      local_218._0_4_ = local_218._4_4_;
      local_218._8_4_ = local_218._4_4_;
      local_218._12_4_ = local_218._4_4_;
      sVar27 = (short)gap;
      sVar23 = (short)iVar30;
      sVar17 = (short)open;
      local_2b8._0_8_ =
           (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
           (ulong)(ushort)(sVar27 * -6 - sVar17) << 0x10 |
           (ulong)(ushort)(sVar27 * -5 - sVar17) << 0x20 |
           (ulong)(ushort)(sVar23 + sVar27 * -4) << 0x30;
      local_2b8._8_6_ =
           CONCAT24(sVar23 - sVar27,CONCAT22(sVar23 + sVar27 * -2,sVar27 * -3 - sVar17));
      auVar58._8_6_ = local_2b8._8_6_;
      auVar58._0_8_ = local_2b8._0_8_;
      auVar58._14_2_ = 0;
      if (0 < _s1Len) {
        piVar2 = matrix->mapper;
        uVar29 = 0;
        do {
          ptr[uVar29] = (int16_t)piVar2[(byte)_s1[uVar29]];
          uVar29 = uVar29 + 1;
        } while ((uint)_s1Len != uVar29);
      }
      uVar18 = s2Len + 7;
      local_354 = _s1Len - 1;
      iVar19 = s2Len + -1;
      uVar42 = auVar56._0_4_;
      local_248 = auVar56._0_2_;
      sStack_246 = auVar56._2_2_;
      uVar69 = auVar80._0_4_;
      local_228 = ZEXT216((ushort)uVar37) << 0x70;
      auVar142._4_4_ = uVar55;
      auVar142._0_4_ = uVar55;
      auVar142._8_4_ = uVar55;
      auVar142._12_4_ = uVar55;
      auVar56 = psllw(auVar142,3);
      auVar57 = paddsw(local_238,auVar100);
      auVar80 = paddsw(local_218,auVar100);
      local_2b8._14_2_ = sVar23;
      lVar21 = (long)_s1Len;
      iVar32 = _s1Len + 1U;
      if ((int)(_s1Len + 1U) < iVar1) {
        iVar32 = iVar1;
      }
      uVar29 = 0;
      memset(ptr + lVar21,0,(ulong)(uint)(~_s1Len + iVar32) * 2 + 2);
      piVar2 = matrix->mapper;
      do {
        ptr_00[uVar29 + 7] = (int16_t)piVar2[(byte)_s2[uVar29]];
        uVar29 = uVar29 + 1;
      } while (uVar22 != uVar29);
      ptr_00[3] = 0;
      ptr_00[4] = 0;
      ptr_00[5] = 0;
      ptr_00[6] = 0;
      ptr_00[0] = 0;
      ptr_00[1] = 0;
      ptr_00[2] = 0;
      ptr_00[3] = 0;
      uVar25 = s2Len + 1U;
      if ((int)(s2Len + 1U) < (int)uVar18) {
        uVar25 = uVar18;
      }
      memset(ptr_00 + uVar22 + 7,0,(ulong)(~s2Len + uVar25) * 2 + 2);
      uVar29 = 0;
      do {
        ptr_01[uVar29 + 7] = (int16_t)iVar30;
        iVar30 = iVar30 - gap;
        ptr_02[uVar29 + 7] = 0;
        ptr_03[uVar29 + 7] = 0;
        ptr_04[uVar29 + 7] = 0;
        ptr_05[uVar29 + 7] = (ushort)uVar37;
        ptr_06[uVar29 + 7] = 0;
        ptr_07[uVar29 + 7] = 0;
        ptr_08[uVar29 + 7] = 0;
        uVar29 = uVar29 + 1;
      } while (uVar22 != uVar29);
      lVar26 = 0;
      do {
        *(undefined2 *)((long)ptr_01 + lVar26) = 0;
        *(undefined2 *)((long)ptr_02 + lVar26) = 0;
        *(undefined2 *)((long)ptr_03 + lVar26) = 0;
        *(undefined2 *)((long)ptr_04 + lVar26) = 0;
        *(undefined2 *)((long)ptr_05 + lVar26) = 0;
        *(undefined2 *)((long)ptr_06 + lVar26) = 0;
        *(undefined2 *)((long)ptr_07 + lVar26) = 0;
        *(undefined2 *)((long)ptr_08 + lVar26) = 0;
        lVar26 = lVar26 + 2;
      } while (lVar26 != 0xe);
      lVar26 = 0;
      do {
        ptr_01[uVar22 + lVar26 + 7] = 0;
        ptr_02[uVar22 + lVar26 + 7] = 0;
        ptr_03[uVar22 + lVar26 + 7] = 0;
        ptr_04[uVar22 + lVar26 + 7] = 0;
        ptr_05[uVar22 + lVar26 + 7] = 0;
        ptr_06[uVar22 + lVar26 + 7] = 0;
        ptr_07[uVar22 + lVar26 + 7] = 0;
        ptr_08[uVar22 + lVar26 + 7] = 0;
        lVar26 = lVar26 + 1;
      } while (s2Len + (int)lVar26 < (int)uVar18);
      ptr_01[6] = 0;
      if (_s1Len < 1) {
        local_288 = CONCAT26(sStack_246,CONCAT24(local_248,uVar42));
        uStack_280 = CONCAT26(sStack_246,CONCAT24(local_248,uVar42));
        auVar59._4_2_ = local_2c8;
        auVar59._0_4_ = uVar41;
        auVar59._6_2_ = sStack_2c6;
        auVar59._8_2_ = local_2c8;
        auVar59._10_2_ = sStack_2c6;
        auVar59._12_2_ = local_2c8;
        auVar59._14_2_ = sStack_2c6;
        auVar71 = auVar59;
        auVar95 = auVar59;
        auVar103 = auVar59;
        local_278 = auVar59;
      }
      else {
        uVar22 = 1;
        if (1 < (int)uVar18) {
          uVar22 = (ulong)uVar18;
        }
        auVar81 = pmovsxbw(auVar58,0x1020304050607);
        auVar59._4_2_ = local_2c8;
        auVar59._0_4_ = uVar41;
        auVar59._6_2_ = sStack_2c6;
        auVar59._8_2_ = local_2c8;
        auVar59._10_2_ = sStack_2c6;
        auVar59._12_2_ = local_2c8;
        auVar59._14_2_ = sStack_2c6;
        local_288 = CONCAT26(sStack_246,CONCAT24(local_248,uVar42));
        uStack_280 = CONCAT26(sStack_246,CONCAT24(local_248,uVar42));
        uVar29 = 0;
        auVar71 = auVar59;
        auVar95 = auVar59;
        auVar103 = auVar59;
        local_278 = auVar59;
        do {
          auVar100 = *(undefined1 (*) [16])(ptr + uVar29);
          if (matrix->type == 0) {
            uVar18 = (uint)auVar100._0_2_;
            uVar33 = (uint)auVar100._2_2_;
            uVar31 = (uint)auVar100._4_2_;
            uVar35 = (uint)auVar100._6_2_;
            uVar28 = (uint)auVar100._8_2_;
            uVar36 = (uint)auVar100._10_2_;
            uVar24 = (uint)auVar100._12_2_;
            uVar25 = (int)auVar100._14_2_;
          }
          else {
            uVar18 = (uint)uVar29;
            uVar33 = uVar18 | 1;
            if (lVar21 <= (long)(uVar29 | 1)) {
              uVar33 = local_354;
            }
            uVar31 = uVar18 | 2;
            if (lVar21 <= (long)(uVar29 | 2)) {
              uVar31 = local_354;
            }
            uVar35 = uVar18 | 3;
            if (lVar21 <= (long)(uVar29 | 3)) {
              uVar35 = local_354;
            }
            uVar28 = uVar18 | 4;
            if (lVar21 <= (long)(uVar29 | 4)) {
              uVar28 = local_354;
            }
            uVar36 = uVar18 | 5;
            if (lVar21 <= (long)(uVar29 | 5)) {
              uVar36 = local_354;
            }
            uVar24 = uVar18 | 6;
            if (lVar21 <= (long)(uVar29 | 6)) {
              uVar24 = local_354;
            }
            uVar25 = uVar18 | 7;
            if (lVar21 <= (long)(uVar29 | 7)) {
              uVar25 = local_354;
            }
          }
          piVar2 = matrix->matrix;
          iVar32 = matrix->size;
          uVar94 = uVar29 + 8;
          auVar129 = ZEXT216((ushort)(sVar23 - (short)uVar29 * sVar27)) << 0x70;
          auVar114 = pshufb(auVar100,_DAT_00907360);
          uVar68 = ptr_01[6];
          ptr_01[6] = sVar23 - (short)uVar94 * sVar27;
          auVar139 = (undefined1  [16])0x0;
          local_238._0_2_ = auVar57._0_2_;
          local_238._2_2_ = auVar57._2_2_;
          local_238._4_2_ = auVar57._4_2_;
          local_238._6_2_ = auVar57._6_2_;
          local_238._8_2_ = auVar57._8_2_;
          local_238._10_2_ = auVar57._10_2_;
          local_238._12_2_ = auVar57._12_2_;
          local_238._14_2_ = auVar57._14_2_;
          uVar38 = 0;
          local_268 = CONCAT26(sStack_2c6,CONCAT24(local_2c8,uVar41));
          uStack_260 = CONCAT26(sStack_2c6,CONCAT24(local_2c8,uVar41));
          auVar90 = (undefined1  [16])0x0;
          auVar92 = (undefined1  [16])0x0;
          local_d8 = 0;
          uStack_d0 = 0;
          auVar97._0_8_ = 0;
          uVar98 = 0;
          local_158 = ZEXT816(0);
          auVar142 = (undefined1  [16])0x0;
          local_148 = local_228;
          auVar115._0_8_ = 0;
          uVar102 = 0;
          local_328 = (undefined1  [16])0x0;
          local_2d8 = (undefined1  [16])0x0;
          local_318 = (undefined1  [16])0x0;
          local_138 = (undefined1  [16])0x0;
          auVar44 = local_228;
          auVar100 = _DAT_00904d00;
          auVar58 = ZEXT216(uVar68) << 0x70;
          do {
            local_1d8._8_8_ = uStack_d0;
            local_1d8._0_8_ = local_d8;
            local_1f8._8_8_ = uVar102;
            local_1f8._0_8_ = auVar115._0_8_;
            local_1e8._8_8_ = uVar98;
            local_1e8._0_8_ = auVar97._0_8_;
            auVar43._0_8_ = auVar129._2_8_;
            auVar43._8_8_ = auVar129._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar38 + 7] << 0x30;
            auVar115._0_8_ = local_318._2_8_;
            uVar102 = local_318._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar38 + 7] << 0x30;
            auVar115._8_8_ = uVar102;
            auVar97._0_8_ = local_2d8._2_8_;
            uVar98 = local_2d8._8_8_ >> 0x10 | (ulong)(ushort)ptr_03[uVar38 + 7] << 0x30;
            auVar97._8_8_ = uVar98;
            auVar82._0_8_ = auVar44._2_8_;
            auVar82._8_8_ = auVar44._8_8_ >> 0x10 | (ulong)(ushort)ptr_05[uVar38 + 7] << 0x30;
            auVar93._0_8_ = auVar92._2_8_;
            auVar93._8_8_ = auVar92._8_8_ >> 0x10 | (ulong)(ushort)ptr_06[uVar38 + 7] << 0x30;
            auVar91._0_8_ = auVar90._2_8_;
            auVar91._8_8_ = auVar90._8_8_ >> 0x10 | (ulong)(ushort)ptr_07[uVar38 + 7] << 0x30;
            auVar14._4_4_ = uVar69;
            auVar14._0_4_ = uVar69;
            auVar14._8_4_ = uVar69;
            auVar14._12_4_ = uVar69;
            auVar44 = psubsw(auVar43,auVar14);
            auVar120._4_4_ = uVar55;
            auVar120._0_4_ = uVar55;
            auVar120._8_4_ = uVar55;
            auVar120._12_4_ = uVar55;
            auVar90 = psubsw(auVar82,auVar120);
            sVar39 = auVar44._0_2_;
            sVar101 = auVar90._0_2_;
            auVar141._0_2_ = -(ushort)(sVar101 < sVar39);
            sVar46 = auVar44._2_2_;
            sVar104 = auVar90._2_2_;
            auVar141._2_2_ = -(ushort)(sVar104 < sVar46);
            sVar48 = auVar44._4_2_;
            sVar105 = auVar90._4_2_;
            auVar141._4_2_ = -(ushort)(sVar105 < sVar48);
            sVar49 = auVar44._6_2_;
            sVar106 = auVar90._6_2_;
            auVar141._6_2_ = -(ushort)(sVar106 < sVar49);
            sVar50 = auVar44._8_2_;
            sVar107 = auVar90._8_2_;
            auVar141._8_2_ = -(ushort)(sVar107 < sVar50);
            sVar51 = auVar44._10_2_;
            sVar109 = auVar90._10_2_;
            auVar141._10_2_ = -(ushort)(sVar109 < sVar51);
            sVar52 = auVar44._12_2_;
            sVar110 = auVar90._12_2_;
            sVar53 = auVar44._14_2_;
            auVar141._12_2_ = -(ushort)(sVar110 < sVar52);
            sVar111 = auVar90._14_2_;
            auVar141._14_2_ = -(ushort)(sVar111 < sVar53);
            auVar92 = pblendvb(auVar93,auVar115,auVar141);
            auVar90 = pblendvb(auVar91,auVar97,auVar141);
            auVar116._0_8_ = local_328._2_8_;
            auVar116._8_8_ = local_328._8_8_ >> 0x10 | (ulong)(ushort)ptr_04[uVar38 + 7] << 0x30;
            auVar140._0_8_ = auVar139._2_8_;
            auVar140._8_8_ = auVar139._8_8_ >> 0x10 | (ulong)(ushort)ptr_08[uVar38 + 7] << 0x30;
            auVar141 = pblendvb(auVar140,auVar116,auVar141);
            auVar129 = psubsw(auVar129,auVar14);
            auVar44 = psubsw(local_148,auVar120);
            sVar118 = auVar44._0_2_;
            sVar128 = auVar129._0_2_;
            auVar130._0_2_ = -(ushort)(sVar118 < sVar128);
            sVar121 = auVar44._2_2_;
            sVar132 = auVar129._2_2_;
            auVar130._2_2_ = -(ushort)(sVar121 < sVar132);
            sVar122 = auVar44._4_2_;
            sVar133 = auVar129._4_2_;
            auVar130._4_2_ = -(ushort)(sVar122 < sVar133);
            sVar123 = auVar44._6_2_;
            sVar134 = auVar129._6_2_;
            auVar130._6_2_ = -(ushort)(sVar123 < sVar134);
            sVar124 = auVar44._8_2_;
            sVar135 = auVar129._8_2_;
            auVar130._8_2_ = -(ushort)(sVar124 < sVar135);
            sVar125 = auVar44._10_2_;
            sVar136 = auVar129._10_2_;
            auVar130._10_2_ = -(ushort)(sVar125 < sVar136);
            sVar126 = auVar44._12_2_;
            sVar137 = auVar129._12_2_;
            sVar138 = auVar129._14_2_;
            auVar130._12_2_ = -(ushort)(sVar126 < sVar137);
            sVar127 = auVar44._14_2_;
            auVar130._14_2_ = -(ushort)(sVar127 < sVar138);
            auVar142 = pblendvb(auVar142,local_318,auVar130);
            local_158 = pblendvb(local_158,local_2d8,auVar130);
            auVar139._10_2_ = (short)piVar2[(long)(int)(uVar31 * iVar32) + (long)ptr_00[uVar38 + 5]]
            ;
            auVar139._8_2_ = (short)piVar2[(long)(int)(uVar35 * iVar32) + (long)ptr_00[uVar38 + 4]];
            auVar139._12_2_ = (short)piVar2[(long)(int)(uVar33 * iVar32) + (long)ptr_00[uVar38 + 6]]
            ;
            sVar34 = local_268._2_2_;
            sVar5 = local_268._4_2_;
            sVar40 = local_268._6_2_;
            sVar7 = (short)uStack_260;
            sVar47 = uStack_260._2_2_;
            sVar54 = uStack_260._4_2_;
            sVar10 = uStack_260._6_2_;
            sVar17 = ptr_00[uVar38 + 7];
            local_e8 = auVar114._0_2_;
            sStack_e6 = auVar114._2_2_;
            sStack_e4 = auVar114._4_2_;
            sStack_e2 = auVar114._6_2_;
            sStack_e0 = auVar114._8_2_;
            sStack_de = auVar114._10_2_;
            sStack_dc = auVar114._12_2_;
            sStack_da = auVar114._14_2_;
            uVar16 = (ulong)local_268 >> 0x10;
            local_268 = CONCAT26((short)uStack_260,(int6)uVar16);
            uVar16 = (ulong)uStack_260 >> 0x10;
            uStack_260 = CONCAT26(sVar17,(int6)uVar16);
            auVar117._0_2_ = (ushort)-(ushort)(local_e8 == sVar34) >> 0xf;
            auVar117._2_2_ = (ushort)-(ushort)(sStack_e6 == sVar5) >> 0xf;
            auVar117._4_2_ = (ushort)-(ushort)(sStack_e4 == sVar40) >> 0xf;
            auVar117._6_2_ = (ushort)-(ushort)(sStack_e2 == sVar7) >> 0xf;
            auVar117._8_2_ = (ushort)-(ushort)(sStack_e0 == sVar47) >> 0xf;
            auVar117._10_2_ = (ushort)-(ushort)(sStack_de == sVar54) >> 0xf;
            auVar117._12_2_ = (ushort)-(ushort)(sStack_dc == sVar10) >> 0xf;
            auVar117._14_2_ = (ushort)-(ushort)(sStack_da == sVar17) >> 0xf;
            auVar44 = paddsw(auVar117,local_1f8);
            auVar139._14_2_ = (short)piVar2[(long)(int)(uVar18 * iVar32) + (long)sVar17];
            auVar139._0_8_ =
                 (ulong)(uint)piVar2[(long)(int)(uVar25 * iVar32) + (long)ptr_00[uVar38]] &
                 0xffffffff0000ffff |
                 (ulong)*(ushort *)
                         (piVar2 + (long)(int)(uVar24 * iVar32) + (long)ptr_00[uVar38 + 1]) << 0x10
                 | (ulong)*(ushort *)
                           (piVar2 + (long)(int)(uVar36 * iVar32) + (long)ptr_00[uVar38 + 2]) <<
                   0x20 | (ulong)*(ushort *)
                                  (piVar2 + (long)(int)(uVar28 * iVar32) + (long)ptr_00[uVar38 + 3])
                          << 0x30;
            uVar79 = (ushort)(sVar39 < sVar101) * sVar101 | (ushort)(sVar39 >= sVar101) * sVar39;
            uVar83 = (ushort)(sVar46 < sVar104) * sVar104 | (ushort)(sVar46 >= sVar104) * sVar46;
            uVar84 = (ushort)(sVar48 < sVar105) * sVar105 | (ushort)(sVar48 >= sVar105) * sVar48;
            uVar85 = (ushort)(sVar49 < sVar106) * sVar106 | (ushort)(sVar49 >= sVar106) * sVar49;
            uVar86 = (ushort)(sVar50 < sVar107) * sVar107 | (ushort)(sVar50 >= sVar107) * sVar50;
            uVar87 = (ushort)(sVar51 < sVar109) * sVar109 | (ushort)(sVar51 >= sVar109) * sVar51;
            uVar88 = (ushort)(sVar52 < sVar110) * sVar110 | (ushort)(sVar52 >= sVar110) * sVar52;
            uVar89 = (ushort)(sVar53 < sVar111) * sVar111 | (ushort)(sVar53 >= sVar111) * sVar53;
            auVar99._0_2_ =
                 (ushort)(sVar128 < sVar118) * sVar118 | (ushort)(sVar128 >= sVar118) * sVar128;
            auVar99._2_2_ =
                 (ushort)(sVar132 < sVar121) * sVar121 | (ushort)(sVar132 >= sVar121) * sVar132;
            auVar99._4_2_ =
                 (ushort)(sVar133 < sVar122) * sVar122 | (ushort)(sVar133 >= sVar122) * sVar133;
            auVar99._6_2_ =
                 (ushort)(sVar134 < sVar123) * sVar123 | (ushort)(sVar134 >= sVar123) * sVar134;
            auVar99._8_2_ =
                 (ushort)(sVar135 < sVar124) * sVar124 | (ushort)(sVar135 >= sVar124) * sVar135;
            auVar99._10_2_ =
                 (ushort)(sVar136 < sVar125) * sVar125 | (ushort)(sVar136 >= sVar125) * sVar136;
            auVar99._12_2_ =
                 (ushort)(sVar137 < sVar126) * sVar126 | (ushort)(sVar137 >= sVar126) * sVar137;
            auVar99._14_2_ =
                 (ushort)(sVar138 < sVar127) * sVar127 | (ushort)(sVar138 >= sVar127) * sVar138;
            auVar119 = pblendvb(local_1d8,local_328,auVar130);
            auVar58 = paddsw(auVar58,auVar139);
            uVar60 = auVar58._0_2_;
            uVar68 = ((short)uVar60 < (short)auVar99._0_2_) * auVar99._0_2_ |
                     ((short)uVar60 >= (short)auVar99._0_2_) * uVar60;
            uVar62 = auVar58._2_2_;
            uVar72 = ((short)uVar62 < (short)auVar99._2_2_) * auVar99._2_2_ |
                     ((short)uVar62 >= (short)auVar99._2_2_) * uVar62;
            uVar64 = auVar58._4_2_;
            uVar73 = ((short)uVar64 < (short)auVar99._4_2_) * auVar99._4_2_ |
                     ((short)uVar64 >= (short)auVar99._4_2_) * uVar64;
            uVar66 = auVar58._6_2_;
            uVar74 = ((short)uVar66 < (short)auVar99._6_2_) * auVar99._6_2_ |
                     ((short)uVar66 >= (short)auVar99._6_2_) * uVar66;
            uVar61 = auVar58._8_2_;
            uVar75 = ((short)uVar61 < (short)auVar99._8_2_) * auVar99._8_2_ |
                     ((short)uVar61 >= (short)auVar99._8_2_) * uVar61;
            uVar63 = auVar58._10_2_;
            uVar76 = ((short)uVar63 < (short)auVar99._10_2_) * auVar99._10_2_ |
                     ((short)uVar63 >= (short)auVar99._10_2_) * uVar63;
            uVar65 = auVar58._12_2_;
            uVar67 = auVar58._14_2_;
            uVar77 = ((short)uVar65 < (short)auVar99._12_2_) * auVar99._12_2_ |
                     ((short)uVar65 >= (short)auVar99._12_2_) * uVar65;
            uVar78 = ((short)uVar67 < (short)auVar99._14_2_) * auVar99._14_2_ |
                     ((short)uVar67 >= (short)auVar99._14_2_) * uVar67;
            auVar131._0_2_ =
                 ((short)uVar68 < (short)uVar79) * uVar79 |
                 ((short)uVar68 >= (short)uVar79) * uVar68;
            auVar131._2_2_ =
                 ((short)uVar72 < (short)uVar83) * uVar83 |
                 ((short)uVar72 >= (short)uVar83) * uVar72;
            auVar131._4_2_ =
                 ((short)uVar73 < (short)uVar84) * uVar84 |
                 ((short)uVar73 >= (short)uVar84) * uVar73;
            auVar131._6_2_ =
                 ((short)uVar74 < (short)uVar85) * uVar85 |
                 ((short)uVar74 >= (short)uVar85) * uVar74;
            auVar131._8_2_ =
                 ((short)uVar75 < (short)uVar86) * uVar86 |
                 ((short)uVar75 >= (short)uVar86) * uVar75;
            auVar131._10_2_ =
                 ((short)uVar76 < (short)uVar87) * uVar87 |
                 ((short)uVar76 >= (short)uVar87) * uVar76;
            auVar131._12_2_ =
                 ((short)uVar77 < (short)uVar88) * uVar88 |
                 ((short)uVar77 >= (short)uVar88) * uVar77;
            auVar131._14_2_ =
                 ((short)uVar78 < (short)uVar89) * uVar89 |
                 ((short)uVar78 >= (short)uVar89) * uVar78;
            auVar129._0_2_ = -(ushort)(uVar60 == auVar131._0_2_);
            auVar129._2_2_ = -(ushort)(uVar62 == auVar131._2_2_);
            auVar129._4_2_ = -(ushort)(uVar64 == auVar131._4_2_);
            auVar129._6_2_ = -(ushort)(uVar66 == auVar131._6_2_);
            auVar129._8_2_ = -(ushort)(uVar61 == auVar131._8_2_);
            auVar129._10_2_ = -(ushort)(uVar63 == auVar131._10_2_);
            auVar129._12_2_ = -(ushort)(uVar65 == auVar131._12_2_);
            auVar129._14_2_ = -(ushort)(uVar67 == auVar131._14_2_);
            auVar70._0_2_ = -(ushort)((short)uVar79 < (short)uVar68);
            auVar70._2_2_ = -(ushort)((short)uVar83 < (short)uVar72);
            auVar70._4_2_ = -(ushort)((short)uVar84 < (short)uVar73);
            auVar70._6_2_ = -(ushort)((short)uVar85 < (short)uVar74);
            auVar70._8_2_ = -(ushort)((short)uVar86 < (short)uVar75);
            auVar70._10_2_ = -(ushort)((short)uVar87 < (short)uVar76);
            auVar70._12_2_ = -(ushort)((short)uVar88 < (short)uVar77);
            auVar70._14_2_ = -(ushort)((short)uVar89 < (short)uVar78);
            auVar58 = pblendvb(auVar92,auVar142,auVar70);
            local_318 = pblendvb(auVar58,auVar44,auVar129);
            auVar44 = pblendvb(auVar90,local_158,auVar70);
            auVar112._0_2_ =
                 (ushort)-(ushort)(0 < (short)((ulong)(uint)piVar2[(long)(int)(uVar25 * iVar32) +
                                                                   (long)ptr_00[uVar38]] &
                                              0xffffffff0000ffff)) >> 0xf;
            auVar112._2_2_ =
                 (ushort)-(ushort)(0 < (short)*(ushort *)
                                               (piVar2 + (long)(int)(uVar24 * iVar32) +
                                                         (long)ptr_00[uVar38 + 1])) >> 0xf;
            auVar112._4_2_ =
                 (ushort)-(ushort)(0 < (short)*(ushort *)
                                               (piVar2 + (long)(int)(uVar36 * iVar32) +
                                                         (long)ptr_00[uVar38 + 2])) >> 0xf;
            auVar112._6_2_ =
                 (ushort)-(ushort)(0 < (short)*(ushort *)
                                               (piVar2 + (long)(int)(uVar28 * iVar32) +
                                                         (long)ptr_00[uVar38 + 3])) >> 0xf;
            auVar112._8_2_ =
                 (ushort)-(ushort)(0 < (short)piVar2[(long)(int)(uVar35 * iVar32) +
                                                     (long)ptr_00[uVar38 + 4]]) >> 0xf;
            auVar112._10_2_ =
                 (ushort)-(ushort)(0 < (short)piVar2[(long)(int)(uVar31 * iVar32) +
                                                     (long)ptr_00[uVar38 + 5]]) >> 0xf;
            auVar112._12_2_ =
                 (ushort)-(ushort)(0 < (short)piVar2[(long)(int)(uVar33 * iVar32) +
                                                     (long)ptr_00[uVar38 + 6]]) >> 0xf;
            auVar112._14_2_ =
                 (ushort)-(ushort)(0 < (short)piVar2[(long)(int)(uVar18 * iVar32) + (long)sVar17])
                 >> 0xf;
            auVar58 = paddsw(auVar112,local_1e8);
            local_2d8 = pblendvb(auVar44,auVar58,auVar129);
            auVar58 = pmovsxbw(auVar129,0x101010101010101);
            auVar139 = paddsw(auVar141,auVar58);
            auVar120 = paddsw(auVar119,auVar58);
            auVar44 = pblendvb(auVar139,auVar120,auVar70);
            auVar58 = paddsw(local_138,auVar58);
            local_328 = pblendvb(auVar44,auVar58,auVar129);
            local_258 = auVar100._0_2_;
            sStack_256 = auVar100._2_2_;
            sStack_254 = auVar100._4_2_;
            sStack_252 = auVar100._6_2_;
            sStack_250 = auVar100._8_2_;
            sStack_24e = auVar100._10_2_;
            sStack_24c = auVar100._12_2_;
            sStack_24a = auVar100._14_2_;
            auVar113._0_2_ = -(ushort)(local_258 == -1);
            auVar113._2_2_ = -(ushort)(sStack_256 == -1);
            auVar113._4_2_ = -(ushort)(sStack_254 == -1);
            auVar113._6_2_ = -(ushort)(sStack_252 == -1);
            auVar113._8_2_ = -(ushort)(sStack_250 == -1);
            auVar113._10_2_ = -(ushort)(sStack_24e == -1);
            auVar113._12_2_ = -(ushort)(sStack_24c == -1);
            auVar113._14_2_ = -(ushort)(sStack_24a == -1);
            auVar129 = pblendvb(auVar131,local_2b8,auVar113);
            local_318 = ~auVar113 & local_318;
            local_2d8 = ~auVar113 & local_2d8;
            local_328 = ~auVar113 & local_328;
            auVar119._4_2_ = local_2c8;
            auVar119._0_4_ = uVar41;
            auVar119._6_2_ = sStack_2c6;
            auVar119._8_2_ = local_2c8;
            auVar119._10_2_ = sStack_2c6;
            auVar119._12_2_ = local_2c8;
            auVar119._14_2_ = sStack_2c6;
            local_148 = pblendvb(auVar99,auVar119,auVar113);
            sVar5 = auVar129._0_2_;
            sVar17 = local_318._0_2_;
            sVar34 = local_328._0_2_;
            sVar40 = local_2d8._0_2_;
            if (7 < uVar38) {
              bVar6 = sVar5 < (short)local_288;
              uVar60 = (ushort)!bVar6 * (short)local_288;
              sVar7 = auVar129._2_2_;
              bVar8 = sVar7 < local_288._2_2_;
              uVar68 = (ushort)!bVar8 * local_288._2_2_;
              sVar47 = auVar129._4_2_;
              bVar9 = sVar47 < local_288._4_2_;
              uVar72 = (ushort)!bVar9 * local_288._4_2_;
              sVar54 = auVar129._6_2_;
              sVar10 = auVar129._8_2_;
              bVar11 = sVar10 < (short)uStack_280;
              uVar62 = (ushort)!bVar11 * (short)uStack_280;
              sVar39 = auVar129._10_2_;
              bVar12 = sVar39 < uStack_280._2_2_;
              uVar73 = (ushort)!bVar12 * uStack_280._2_2_;
              sVar46 = auVar129._12_2_;
              bVar13 = sVar46 < uStack_280._4_2_;
              uVar64 = (ushort)!bVar13 * uStack_280._4_2_;
              sVar48 = auVar129._14_2_;
              local_288 = CONCAT26((ushort)(sVar54 < local_288._6_2_) * sVar54 |
                                   (ushort)(sVar54 >= local_288._6_2_) * local_288._6_2_,
                                   CONCAT24((ushort)bVar9 * sVar47 | uVar72,
                                            CONCAT22((ushort)bVar8 * sVar7 | uVar68,
                                                     (ushort)bVar6 * sVar5 | uVar60)));
              uStack_280 = CONCAT26((ushort)(sVar48 < uStack_280._6_2_) * sVar48 |
                                    (ushort)(sVar48 >= uStack_280._6_2_) * uStack_280._6_2_,
                                    CONCAT24((ushort)bVar13 * sVar46 | uVar64,
                                             CONCAT22((ushort)bVar12 * sVar39 | uVar73,
                                                      (ushort)bVar11 * sVar10 | uVar62)));
              uVar68 = (ushort)((short)local_278._0_2_ < sVar5) * sVar5 |
                       (ushort)((short)local_278._0_2_ >= sVar5) * local_278._0_2_;
              uVar60 = (ushort)((short)local_278._2_2_ < sVar7) * sVar7 |
                       (ushort)((short)local_278._2_2_ >= sVar7) * local_278._2_2_;
              uVar72 = (ushort)((short)local_278._4_2_ < sVar47) * sVar47 |
                       (ushort)((short)local_278._4_2_ >= sVar47) * local_278._4_2_;
              uVar62 = (ushort)((short)local_278._6_2_ < sVar54) * sVar54 |
                       (ushort)((short)local_278._6_2_ >= sVar54) * local_278._6_2_;
              uVar73 = (ushort)((short)local_278._8_2_ < sVar10) * sVar10 |
                       (ushort)((short)local_278._8_2_ >= sVar10) * local_278._8_2_;
              uVar64 = (ushort)((short)local_278._10_2_ < sVar39) * sVar39 |
                       (ushort)((short)local_278._10_2_ >= sVar39) * local_278._10_2_;
              uVar74 = (ushort)((short)local_278._12_2_ < sVar46) * sVar46 |
                       (ushort)((short)local_278._12_2_ >= sVar46) * local_278._12_2_;
              uVar66 = (ushort)((short)local_278._14_2_ < sVar48) * sVar48 |
                       (ushort)((short)local_278._14_2_ >= sVar48) * local_278._14_2_;
              uVar75 = (ushort)((short)uVar68 < sVar17) * sVar17 |
                       ((short)uVar68 >= sVar17) * uVar68;
              sVar7 = local_318._2_2_;
              uVar61 = (ushort)((short)uVar60 < sVar7) * sVar7 | ((short)uVar60 >= sVar7) * uVar60;
              sVar7 = local_318._4_2_;
              uVar76 = (ushort)((short)uVar72 < sVar7) * sVar7 | ((short)uVar72 >= sVar7) * uVar72;
              sVar7 = local_318._6_2_;
              uVar63 = (ushort)((short)uVar62 < sVar7) * sVar7 | ((short)uVar62 >= sVar7) * uVar62;
              sVar7 = local_318._8_2_;
              uVar77 = (ushort)((short)uVar73 < sVar7) * sVar7 | ((short)uVar73 >= sVar7) * uVar73;
              sVar7 = local_318._10_2_;
              uVar65 = (ushort)((short)uVar64 < sVar7) * sVar7 | ((short)uVar64 >= sVar7) * uVar64;
              sVar7 = local_318._12_2_;
              uVar78 = (ushort)((short)uVar74 < sVar7) * sVar7 | ((short)uVar74 >= sVar7) * uVar74;
              sVar7 = local_318._14_2_;
              uVar67 = (ushort)((short)uVar66 < sVar7) * sVar7 | ((short)uVar66 >= sVar7) * uVar66;
              uVar68 = (ushort)(sVar40 < sVar34) * sVar34 | (ushort)(sVar40 >= sVar34) * sVar40;
              sVar7 = local_328._2_2_;
              sVar47 = local_2d8._2_2_;
              uVar60 = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
              sVar7 = local_328._4_2_;
              sVar47 = local_2d8._4_2_;
              uVar72 = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
              sVar7 = local_328._6_2_;
              sVar47 = local_2d8._6_2_;
              uVar62 = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
              sVar7 = local_328._8_2_;
              sVar47 = local_2d8._8_2_;
              uVar73 = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
              sVar7 = local_328._10_2_;
              sVar47 = local_2d8._10_2_;
              uVar64 = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
              sVar7 = local_328._12_2_;
              sVar47 = local_2d8._12_2_;
              sVar54 = local_2d8._14_2_;
              uVar74 = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
              sVar7 = local_328._14_2_;
              uVar66 = (ushort)(sVar54 < sVar7) * sVar7 | (ushort)(sVar54 >= sVar7) * sVar54;
              local_278._2_2_ =
                   ((short)uVar61 < (short)uVar60) * uVar60 |
                   ((short)uVar61 >= (short)uVar60) * uVar61;
              local_278._0_2_ =
                   ((short)uVar75 < (short)uVar68) * uVar68 |
                   ((short)uVar75 >= (short)uVar68) * uVar75;
              local_278._4_2_ =
                   ((short)uVar76 < (short)uVar72) * uVar72 |
                   ((short)uVar76 >= (short)uVar72) * uVar76;
              local_278._6_2_ =
                   ((short)uVar63 < (short)uVar62) * uVar62 |
                   ((short)uVar63 >= (short)uVar62) * uVar63;
              local_278._8_2_ =
                   ((short)uVar77 < (short)uVar73) * uVar73 |
                   ((short)uVar77 >= (short)uVar73) * uVar77;
              local_278._10_2_ =
                   ((short)uVar65 < (short)uVar64) * uVar64 |
                   ((short)uVar65 >= (short)uVar64) * uVar65;
              local_278._12_2_ =
                   ((short)uVar78 < (short)uVar74) * uVar74 |
                   ((short)uVar78 >= (short)uVar74) * uVar78;
              local_278._14_2_ =
                   ((short)uVar67 < (short)uVar66) * uVar66 |
                   ((short)uVar67 >= (short)uVar66) * uVar67;
            }
            auVar142 = ~auVar113 & auVar142;
            local_158 = ~auVar113 & local_158;
            auVar58 = ~auVar113 & auVar120;
            puVar3 = (undefined8 *)((ppVar20->field_4).trace)->trace_del_table;
            vWH[0] = uVar29 & 0xffffffff;
            i = (int32_t)uVar38;
            vWH[1]._0_4_ = _s1Len;
            vWH[1]._4_4_ = 0;
            arr_store_rowcol((int *)*puVar3,(int *)puVar3[4],vWH,i,s2Len,in_stack_fffffffffffffc98,
                             in_stack_fffffffffffffca0);
            pvVar4 = ((ppVar20->field_4).trace)->trace_del_table;
            vWH_00[0] = uVar29 & 0xffffffff;
            vWH_00[1]._0_4_ = _s1Len;
            vWH_00[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar4 + 8),*(int **)((long)pvVar4 + 0x28),vWH_00,i,
                             s2Len,in_stack_fffffffffffffc98,in_stack_fffffffffffffca0);
            pvVar4 = ((ppVar20->field_4).trace)->trace_del_table;
            vWH_01[0] = uVar29 & 0xffffffff;
            vWH_01[1]._0_4_ = _s1Len;
            vWH_01[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar4 + 0x10),*(int **)((long)pvVar4 + 0x30),vWH_01,i,
                             s2Len,in_stack_fffffffffffffc98,in_stack_fffffffffffffca0);
            pvVar4 = ((ppVar20->field_4).trace)->trace_del_table;
            vWH_02[0] = uVar29 & 0xffffffff;
            vWH_02[1]._0_4_ = _s1Len;
            vWH_02[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar4 + 0x18),*(int **)((long)pvVar4 + 0x38),vWH_02,i,
                             s2Len,in_stack_fffffffffffffc98,in_stack_fffffffffffffca0);
            local_218._0_2_ = auVar80._0_2_;
            local_218._2_2_ = auVar80._2_2_;
            local_218._4_2_ = auVar80._4_2_;
            local_218._6_2_ = auVar80._6_2_;
            local_218._8_2_ = auVar80._8_2_;
            local_218._10_2_ = auVar80._10_2_;
            local_218._12_2_ = auVar80._12_2_;
            local_218._14_2_ = auVar80._14_2_;
            auVar45._0_2_ = -(ushort)(local_258 == local_218._0_2_);
            auVar45._2_2_ = -(ushort)(sStack_256 == local_218._2_2_);
            auVar45._4_2_ = -(ushort)(sStack_254 == local_218._4_2_);
            auVar45._6_2_ = -(ushort)(sStack_252 == local_218._6_2_);
            auVar45._8_2_ = -(ushort)(sStack_250 == local_218._8_2_);
            auVar45._10_2_ = -(ushort)(sStack_24e == local_218._10_2_);
            auVar45._12_2_ = -(ushort)(sStack_24c == local_218._12_2_);
            auVar45._14_2_ = -(ushort)(sStack_24a == local_218._14_2_);
            auVar15._2_2_ = -(ushort)(auVar81._2_2_ == local_238._2_2_);
            auVar15._0_2_ = -(ushort)(auVar81._0_2_ == local_238._0_2_);
            auVar15._4_2_ = -(ushort)(auVar81._4_2_ == local_238._4_2_);
            auVar15._6_2_ = -(ushort)(auVar81._6_2_ == local_238._6_2_);
            auVar15._8_2_ = -(ushort)(auVar81._8_2_ == local_238._8_2_);
            auVar15._10_2_ = -(ushort)(auVar81._10_2_ == local_238._10_2_);
            auVar15._12_2_ = -(ushort)(auVar81._12_2_ == local_238._12_2_);
            auVar15._14_2_ = -(ushort)(auVar81._14_2_ == local_238._14_2_);
            auVar45 = auVar45 & auVar15;
            auVar103 = pblendvb(auVar103,auVar129,auVar45);
            auVar95 = pblendvb(auVar95,local_318,auVar45);
            auVar71 = pblendvb(auVar71,local_2d8,auVar45);
            ptr_01[uVar38] = sVar5;
            ptr_02[uVar38] = sVar17;
            ptr_03[uVar38] = sVar40;
            ptr_04[uVar38] = sVar34;
            auVar44._2_2_ = uVar83;
            auVar44._0_2_ = uVar79;
            auVar44._4_2_ = uVar84;
            auVar44._6_2_ = uVar85;
            auVar44._8_2_ = uVar86;
            auVar44._10_2_ = uVar87;
            auVar44._12_2_ = uVar88;
            auVar44._14_2_ = uVar89;
            ptr_05[uVar38] = uVar79;
            ptr_06[uVar38] = auVar92._0_2_;
            ptr_07[uVar38] = auVar90._0_2_;
            ptr_08[uVar38] = auVar139._0_2_;
            auVar59 = pblendvb(auVar59,local_328,auVar45);
            auVar119 = pmovsxbw(auVar120,0x101010101010101);
            auVar100 = paddsw(auVar100,auVar119);
            uVar38 = uVar38 + 1;
            local_d8 = auVar58._0_8_;
            uStack_d0 = auVar58._8_8_;
            auVar58 = auVar43;
            local_138 = auVar116;
          } while (uVar22 != uVar38);
          auVar81 = paddsw(auVar81,_DAT_00904d20);
          local_2b8 = psubsw(local_2b8,auVar56);
          uVar29 = uVar94;
        } while ((long)uVar94 < lVar21);
      }
      iVar32 = 8;
      uVar18 = uVar37;
      uVar25 = uVar37;
      uVar33 = uVar37;
      do {
        uVar102 = auVar103._0_8_;
        lVar108 = auVar103._8_8_;
        uVar94 = auVar95._0_8_;
        lVar96 = auVar95._8_8_;
        uVar29 = auVar71._0_8_;
        lVar26 = auVar71._8_8_;
        uVar22 = auVar59._0_8_;
        lVar21 = auVar59._8_8_;
        if ((short)uVar37 < (short)auVar103._14_2_) {
          uVar18 = (uint)auVar95._14_2_;
          uVar33 = (uint)auVar71._14_2_;
          uVar25 = (uint)auVar59._14_2_;
          uVar37 = (uint)auVar103._14_2_;
        }
        sVar34 = (short)uVar37;
        sVar23 = (short)uVar25;
        sVar17 = (short)uVar33;
        sVar27 = (short)uVar18;
        auVar103._0_8_ = uVar102 << 0x10;
        auVar103._8_8_ = lVar108 << 0x10 | uVar102 >> 0x30;
        auVar95._0_8_ = uVar94 << 0x10;
        auVar95._8_8_ = lVar96 << 0x10 | uVar94 >> 0x30;
        auVar71._0_8_ = uVar29 << 0x10;
        auVar71._8_8_ = lVar26 << 0x10 | uVar29 >> 0x30;
        auVar59._0_8_ = uVar22 << 0x10;
        auVar59._8_8_ = lVar21 << 0x10 | uVar22 >> 0x30;
        iVar32 = iVar32 + -1;
      } while (iVar32 != 0);
      auVar90._0_2_ = -(ushort)((short)local_288 < local_2c8);
      auVar90._2_2_ = -(ushort)(local_288._2_2_ < sStack_2c6);
      auVar90._4_2_ = -(ushort)(local_288._4_2_ < local_2c8);
      auVar90._6_2_ = -(ushort)(local_288._6_2_ < sStack_2c6);
      auVar90._8_2_ = -(ushort)((short)uStack_280 < local_2c8);
      auVar90._10_2_ = -(ushort)(uStack_280._2_2_ < sStack_2c6);
      auVar90._12_2_ = -(ushort)(uStack_280._4_2_ < local_2c8);
      auVar90._14_2_ = -(ushort)(uStack_280._6_2_ < sStack_2c6);
      auVar92._0_2_ = -(ushort)(local_248 < (short)local_278._0_2_);
      auVar92._2_2_ = -(ushort)(sStack_246 < (short)local_278._2_2_);
      auVar92._4_2_ = -(ushort)(local_248 < (short)local_278._4_2_);
      auVar92._6_2_ = -(ushort)(sStack_246 < (short)local_278._6_2_);
      auVar92._8_2_ = -(ushort)(local_248 < (short)local_278._8_2_);
      auVar92._10_2_ = -(ushort)(sStack_246 < (short)local_278._10_2_);
      auVar92._12_2_ = -(ushort)(local_248 < (short)local_278._12_2_);
      auVar92._14_2_ = -(ushort)(sStack_246 < (short)local_278._14_2_);
      auVar92 = auVar92 | auVar90;
      if ((((((((((((((((auVar92 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar92 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar92 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar92 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar92 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar92 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar92 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar92 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar92 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar92 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar92[0xf] < '\0'
         ) {
        *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
        sVar17 = 0;
        sVar23 = 0;
        sVar27 = 0;
        sVar34 = 0;
        iVar19 = 0;
        local_354 = 0;
      }
      ppVar20->score = (int)sVar34;
      ppVar20->end_query = local_354;
      ppVar20->end_ref = iVar19;
      *(int *)(ppVar20->field_4).extra = (int)sVar27;
      ((ppVar20->field_4).stats)->similar = (int)sVar17;
      ((ppVar20->field_4).stats)->length = (int)sVar23;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar20;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vNegInf0 = _mm_insert_epi16(vZero, NEG_LIMIT, 7);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
            matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
            similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
            length= (int16_t) _mm_extract_epi16(vMaxL, 7);
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
        vMaxM = _mm_slli_si128(vMaxM, 2);
        vMaxS = _mm_slli_si128(vMaxS, 2);
        vMaxL = _mm_slli_si128(vMaxL, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}